

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O0

void __thiscall
v_hashmap<substring,_unsigned_long>::iter
          (v_hashmap<substring,_unsigned_long> *this,_func_void_substring_unsigned_long *func)

{
  hash_elem **pphVar1;
  code *in_RSI;
  long in_RDI;
  hash_elem *e;
  hash_elem *local_18;
  
  pphVar1 = v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::begin
                      ((v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *)(in_RDI + 0x18));
  for (local_18 = *pphVar1; local_18 != *(hash_elem **)(in_RDI + 0x28); local_18 = local_18 + 1) {
    if ((local_18->occupied & 1U) != 0) {
      (*in_RSI)((local_18->key).begin,(local_18->key).end,local_18->val);
    }
  }
  return;
}

Assistant:

void iter(void (*func)(K, V))
  {  // for (size_t lp=0; lp<base_size(); lp++) {
    for (hash_elem* e = dat.begin(); e != dat.end_array; e++)
    {  // hash_elem* e = dat.begin()+lp;
      if (e->occupied)
      {  // printf("  [lp=%d\tocc=%d\thash=%llu]\n", lp, e->occupied, e->hash);
        func(e->key, e->val);
      }
    }
  }